

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavLog.cpp
# Opt level: O1

void WavParserHelper::PrintRF64Header(RF64Header *wavHeader)

{
  DS64Chunk rhs;
  ExtensibleFmtChunk rhs_00;
  BextChunk rhs_01;
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  undefined8 local_598;
  undefined8 uStackY_590;
  unsigned_long local_588;
  unsigned_long uStackY_580;
  undefined8 local_578;
  unsigned_long uStackY_570;
  undefined8 local_568;
  undefined8 uStackY_560;
  DataChunk in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffb00 [32];
  RF64Chunk in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb30 [20];
  undefined1 in_stack_fffffffffffffb44 [28];
  undefined1 in_stack_fffffffffffffba0 [312];
  undefined8 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  undefined8 uVar5;
  undefined8 uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  undefined8 uVar9;
  unsigned_long uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 in_stack_fffffffffffffd38 [64];
  undefined4 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7c [148];
  
  bVar4 = 0;
  local_598 = *(undefined8 *)&wavHeader->RF64Chunk;
  uStackY_590 = *(undefined8 *)((long)&(wavHeader->RF64Chunk).ckSize + 4);
  uVar13 = local_598;
  uVar14 = uStackY_590;
  PrintRF64Chunk(in_stack_fffffffffffffb20);
  memcpy(&stack0xfffffffffffffd38,&wavHeader->DS64Chunk,0x44);
  puVar2 = (undefined8 *)&stack0xfffffffffffffd38;
  puVar3 = &local_598;
  for (lVar1 = 8; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  rhs._32_16_ = in_stack_fffffffffffffb20;
  rhs._0_32_ = in_stack_fffffffffffffb00;
  rhs._48_20_ = in_stack_fffffffffffffb30;
  PrintDS64Chunk(rhs);
  local_598 = *(undefined8 *)&(wavHeader->fmtChunk).standardFmtChunk;
  uStackY_590 = *(undefined8 *)((long)&(wavHeader->fmtChunk).standardFmtChunk.ckSize + 4);
  local_588 = (wavHeader->fmtChunk).standardFmtChunk.nSamplesPerSec;
  uStackY_580 = (wavHeader->fmtChunk).standardFmtChunk.nAvgBytesPerSec;
  local_578 = *(undefined8 *)&(wavHeader->fmtChunk).standardFmtChunk.nBlockAlign;
  uStackY_570 = (wavHeader->fmtChunk).dwChannelMask;
  local_568 = *(undefined8 *)(wavHeader->fmtChunk).SubFormat;
  uStackY_560 = *(undefined8 *)((wavHeader->fmtChunk).SubFormat + 8);
  rhs_00.standardFmtChunk.nSamplesPerSec = in_stack_fffffffffffffb30._0_8_;
  rhs_00.standardFmtChunk.nAvgBytesPerSec = in_stack_fffffffffffffb30._8_8_;
  rhs_00.standardFmtChunk.nBlockAlign = in_stack_fffffffffffffb30._16_2_;
  rhs_00.standardFmtChunk.wBitsPerSample = in_stack_fffffffffffffb30._18_2_;
  rhs_00.standardFmtChunk._0_16_ = in_stack_fffffffffffffb20;
  rhs_00.cbSize = in_stack_fffffffffffffb44._0_2_;
  rhs_00.wValidBitsPerSample = in_stack_fffffffffffffb44._2_2_;
  rhs_00.dwChannelMask = in_stack_fffffffffffffb44._4_8_;
  rhs_00.SubFormat[0] = in_stack_fffffffffffffb44[0xc];
  rhs_00.SubFormat[1] = in_stack_fffffffffffffb44[0xd];
  rhs_00.SubFormat[2] = in_stack_fffffffffffffb44[0xe];
  rhs_00.SubFormat[3] = in_stack_fffffffffffffb44[0xf];
  rhs_00.SubFormat[4] = in_stack_fffffffffffffb44[0x10];
  rhs_00.SubFormat[5] = in_stack_fffffffffffffb44[0x11];
  rhs_00.SubFormat[6] = in_stack_fffffffffffffb44[0x12];
  rhs_00.SubFormat[7] = in_stack_fffffffffffffb44[0x13];
  rhs_00.SubFormat[8] = in_stack_fffffffffffffb44[0x14];
  rhs_00.SubFormat[9] = in_stack_fffffffffffffb44[0x15];
  rhs_00.SubFormat[10] = in_stack_fffffffffffffb44[0x16];
  rhs_00.SubFormat[0xb] = in_stack_fffffffffffffb44[0x17];
  rhs_00.SubFormat[0xc] = in_stack_fffffffffffffb44[0x18];
  rhs_00.SubFormat[0xd] = in_stack_fffffffffffffb44[0x19];
  rhs_00.SubFormat[0xe] = in_stack_fffffffffffffb44[0x1a];
  rhs_00.SubFormat[0xf] = in_stack_fffffffffffffb44[0x1b];
  uVar5 = local_598;
  uVar6 = uStackY_590;
  uVar7 = local_588;
  uVar8 = uStackY_580;
  uVar9 = local_578;
  uVar10 = uStackY_570;
  uVar11 = local_568;
  uVar12 = uStackY_560;
  PrintExtensibleFmtChunk(rhs_00);
  memcpy(&stack0xfffffffffffffd80,&wavHeader->BextChunk,0x270);
  puVar2 = (undefined8 *)&stack0xfffffffffffffd80;
  puVar3 = &local_598;
  for (lVar1 = 0x4e; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  rhs_01.OriginatorReference[0xc] = (char)in_stack_fffffffffffffcd8;
  rhs_01.OriginatorReference[0xd] = (char)((ulong)in_stack_fffffffffffffcd8 >> 8);
  rhs_01.OriginatorReference[0xe] = (char)((ulong)in_stack_fffffffffffffcd8 >> 0x10);
  rhs_01.OriginatorReference[0xf] = (char)((ulong)in_stack_fffffffffffffcd8 >> 0x18);
  rhs_01.OriginatorReference[0x10] = (char)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
  rhs_01.OriginatorReference[0x11] = (char)((ulong)in_stack_fffffffffffffcd8 >> 0x28);
  rhs_01.OriginatorReference[0x12] = (char)((ulong)in_stack_fffffffffffffcd8 >> 0x30);
  rhs_01.OriginatorReference[0x13] = (char)((ulong)in_stack_fffffffffffffcd8 >> 0x38);
  rhs_01.ckID[0] = in_stack_fffffffffffffba0[0];
  rhs_01.ckID[1] = in_stack_fffffffffffffba0[1];
  rhs_01.ckID[2] = in_stack_fffffffffffffba0[2];
  rhs_01.ckID[3] = in_stack_fffffffffffffba0[3];
  rhs_01.ckSize = in_stack_fffffffffffffba0._4_8_;
  rhs_01.Description[0] = in_stack_fffffffffffffba0[0xc];
  rhs_01.Description[1] = in_stack_fffffffffffffba0[0xd];
  rhs_01.Description[2] = in_stack_fffffffffffffba0[0xe];
  rhs_01.Description[3] = in_stack_fffffffffffffba0[0xf];
  rhs_01.Description[4] = in_stack_fffffffffffffba0[0x10];
  rhs_01.Description[5] = in_stack_fffffffffffffba0[0x11];
  rhs_01.Description[6] = in_stack_fffffffffffffba0[0x12];
  rhs_01.Description[7] = in_stack_fffffffffffffba0[0x13];
  rhs_01.Description[8] = in_stack_fffffffffffffba0[0x14];
  rhs_01.Description[9] = in_stack_fffffffffffffba0[0x15];
  rhs_01.Description[10] = in_stack_fffffffffffffba0[0x16];
  rhs_01.Description[0xb] = in_stack_fffffffffffffba0[0x17];
  rhs_01.Description[0xc] = in_stack_fffffffffffffba0[0x18];
  rhs_01.Description[0xd] = in_stack_fffffffffffffba0[0x19];
  rhs_01.Description[0xe] = in_stack_fffffffffffffba0[0x1a];
  rhs_01.Description[0xf] = in_stack_fffffffffffffba0[0x1b];
  rhs_01.Description[0x10] = in_stack_fffffffffffffba0[0x1c];
  rhs_01.Description[0x11] = in_stack_fffffffffffffba0[0x1d];
  rhs_01.Description[0x12] = in_stack_fffffffffffffba0[0x1e];
  rhs_01.Description[0x13] = in_stack_fffffffffffffba0[0x1f];
  rhs_01.Description[0x14] = in_stack_fffffffffffffba0[0x20];
  rhs_01.Description[0x15] = in_stack_fffffffffffffba0[0x21];
  rhs_01.Description[0x16] = in_stack_fffffffffffffba0[0x22];
  rhs_01.Description[0x17] = in_stack_fffffffffffffba0[0x23];
  rhs_01.Description[0x18] = in_stack_fffffffffffffba0[0x24];
  rhs_01.Description[0x19] = in_stack_fffffffffffffba0[0x25];
  rhs_01.Description[0x1a] = in_stack_fffffffffffffba0[0x26];
  rhs_01.Description[0x1b] = in_stack_fffffffffffffba0[0x27];
  rhs_01.Description[0x1c] = in_stack_fffffffffffffba0[0x28];
  rhs_01.Description[0x1d] = in_stack_fffffffffffffba0[0x29];
  rhs_01.Description[0x1e] = in_stack_fffffffffffffba0[0x2a];
  rhs_01.Description[0x1f] = in_stack_fffffffffffffba0[0x2b];
  rhs_01.Description[0x20] = in_stack_fffffffffffffba0[0x2c];
  rhs_01.Description[0x21] = in_stack_fffffffffffffba0[0x2d];
  rhs_01.Description[0x22] = in_stack_fffffffffffffba0[0x2e];
  rhs_01.Description[0x23] = in_stack_fffffffffffffba0[0x2f];
  rhs_01.Description[0x24] = in_stack_fffffffffffffba0[0x30];
  rhs_01.Description[0x25] = in_stack_fffffffffffffba0[0x31];
  rhs_01.Description[0x26] = in_stack_fffffffffffffba0[0x32];
  rhs_01.Description[0x27] = in_stack_fffffffffffffba0[0x33];
  rhs_01.Description[0x28] = in_stack_fffffffffffffba0[0x34];
  rhs_01.Description[0x29] = in_stack_fffffffffffffba0[0x35];
  rhs_01.Description[0x2a] = in_stack_fffffffffffffba0[0x36];
  rhs_01.Description[0x2b] = in_stack_fffffffffffffba0[0x37];
  rhs_01.Description[0x2c] = in_stack_fffffffffffffba0[0x38];
  rhs_01.Description[0x2d] = in_stack_fffffffffffffba0[0x39];
  rhs_01.Description[0x2e] = in_stack_fffffffffffffba0[0x3a];
  rhs_01.Description[0x2f] = in_stack_fffffffffffffba0[0x3b];
  rhs_01.Description[0x30] = in_stack_fffffffffffffba0[0x3c];
  rhs_01.Description[0x31] = in_stack_fffffffffffffba0[0x3d];
  rhs_01.Description[0x32] = in_stack_fffffffffffffba0[0x3e];
  rhs_01.Description[0x33] = in_stack_fffffffffffffba0[0x3f];
  rhs_01.Description[0x34] = in_stack_fffffffffffffba0[0x40];
  rhs_01.Description[0x35] = in_stack_fffffffffffffba0[0x41];
  rhs_01.Description[0x36] = in_stack_fffffffffffffba0[0x42];
  rhs_01.Description[0x37] = in_stack_fffffffffffffba0[0x43];
  rhs_01.Description[0x38] = in_stack_fffffffffffffba0[0x44];
  rhs_01.Description[0x39] = in_stack_fffffffffffffba0[0x45];
  rhs_01.Description[0x3a] = in_stack_fffffffffffffba0[0x46];
  rhs_01.Description[0x3b] = in_stack_fffffffffffffba0[0x47];
  rhs_01.Description[0x3c] = in_stack_fffffffffffffba0[0x48];
  rhs_01.Description[0x3d] = in_stack_fffffffffffffba0[0x49];
  rhs_01.Description[0x3e] = in_stack_fffffffffffffba0[0x4a];
  rhs_01.Description[0x3f] = in_stack_fffffffffffffba0[0x4b];
  rhs_01.Description[0x40] = in_stack_fffffffffffffba0[0x4c];
  rhs_01.Description[0x41] = in_stack_fffffffffffffba0[0x4d];
  rhs_01.Description[0x42] = in_stack_fffffffffffffba0[0x4e];
  rhs_01.Description[0x43] = in_stack_fffffffffffffba0[0x4f];
  rhs_01.Description[0x44] = in_stack_fffffffffffffba0[0x50];
  rhs_01.Description[0x45] = in_stack_fffffffffffffba0[0x51];
  rhs_01.Description[0x46] = in_stack_fffffffffffffba0[0x52];
  rhs_01.Description[0x47] = in_stack_fffffffffffffba0[0x53];
  rhs_01.Description[0x48] = in_stack_fffffffffffffba0[0x54];
  rhs_01.Description[0x49] = in_stack_fffffffffffffba0[0x55];
  rhs_01.Description[0x4a] = in_stack_fffffffffffffba0[0x56];
  rhs_01.Description[0x4b] = in_stack_fffffffffffffba0[0x57];
  rhs_01.Description[0x4c] = in_stack_fffffffffffffba0[0x58];
  rhs_01.Description[0x4d] = in_stack_fffffffffffffba0[0x59];
  rhs_01.Description[0x4e] = in_stack_fffffffffffffba0[0x5a];
  rhs_01.Description[0x4f] = in_stack_fffffffffffffba0[0x5b];
  rhs_01.Description[0x50] = in_stack_fffffffffffffba0[0x5c];
  rhs_01.Description[0x51] = in_stack_fffffffffffffba0[0x5d];
  rhs_01.Description[0x52] = in_stack_fffffffffffffba0[0x5e];
  rhs_01.Description[0x53] = in_stack_fffffffffffffba0[0x5f];
  rhs_01.Description[0x54] = in_stack_fffffffffffffba0[0x60];
  rhs_01.Description[0x55] = in_stack_fffffffffffffba0[0x61];
  rhs_01.Description[0x56] = in_stack_fffffffffffffba0[0x62];
  rhs_01.Description[0x57] = in_stack_fffffffffffffba0[99];
  rhs_01.Description[0x58] = in_stack_fffffffffffffba0[100];
  rhs_01.Description[0x59] = in_stack_fffffffffffffba0[0x65];
  rhs_01.Description[0x5a] = in_stack_fffffffffffffba0[0x66];
  rhs_01.Description[0x5b] = in_stack_fffffffffffffba0[0x67];
  rhs_01.Description[0x5c] = in_stack_fffffffffffffba0[0x68];
  rhs_01.Description[0x5d] = in_stack_fffffffffffffba0[0x69];
  rhs_01.Description[0x5e] = in_stack_fffffffffffffba0[0x6a];
  rhs_01.Description[0x5f] = in_stack_fffffffffffffba0[0x6b];
  rhs_01.Description[0x60] = in_stack_fffffffffffffba0[0x6c];
  rhs_01.Description[0x61] = in_stack_fffffffffffffba0[0x6d];
  rhs_01.Description[0x62] = in_stack_fffffffffffffba0[0x6e];
  rhs_01.Description[99] = in_stack_fffffffffffffba0[0x6f];
  rhs_01.Description[100] = in_stack_fffffffffffffba0[0x70];
  rhs_01.Description[0x65] = in_stack_fffffffffffffba0[0x71];
  rhs_01.Description[0x66] = in_stack_fffffffffffffba0[0x72];
  rhs_01.Description[0x67] = in_stack_fffffffffffffba0[0x73];
  rhs_01.Description[0x68] = in_stack_fffffffffffffba0[0x74];
  rhs_01.Description[0x69] = in_stack_fffffffffffffba0[0x75];
  rhs_01.Description[0x6a] = in_stack_fffffffffffffba0[0x76];
  rhs_01.Description[0x6b] = in_stack_fffffffffffffba0[0x77];
  rhs_01.Description[0x6c] = in_stack_fffffffffffffba0[0x78];
  rhs_01.Description[0x6d] = in_stack_fffffffffffffba0[0x79];
  rhs_01.Description[0x6e] = in_stack_fffffffffffffba0[0x7a];
  rhs_01.Description[0x6f] = in_stack_fffffffffffffba0[0x7b];
  rhs_01.Description[0x70] = in_stack_fffffffffffffba0[0x7c];
  rhs_01.Description[0x71] = in_stack_fffffffffffffba0[0x7d];
  rhs_01.Description[0x72] = in_stack_fffffffffffffba0[0x7e];
  rhs_01.Description[0x73] = in_stack_fffffffffffffba0[0x7f];
  rhs_01.Description[0x74] = in_stack_fffffffffffffba0[0x80];
  rhs_01.Description[0x75] = in_stack_fffffffffffffba0[0x81];
  rhs_01.Description[0x76] = in_stack_fffffffffffffba0[0x82];
  rhs_01.Description[0x77] = in_stack_fffffffffffffba0[0x83];
  rhs_01.Description[0x78] = in_stack_fffffffffffffba0[0x84];
  rhs_01.Description[0x79] = in_stack_fffffffffffffba0[0x85];
  rhs_01.Description[0x7a] = in_stack_fffffffffffffba0[0x86];
  rhs_01.Description[0x7b] = in_stack_fffffffffffffba0[0x87];
  rhs_01.Description[0x7c] = in_stack_fffffffffffffba0[0x88];
  rhs_01.Description[0x7d] = in_stack_fffffffffffffba0[0x89];
  rhs_01.Description[0x7e] = in_stack_fffffffffffffba0[0x8a];
  rhs_01.Description[0x7f] = in_stack_fffffffffffffba0[0x8b];
  rhs_01.Description[0x80] = in_stack_fffffffffffffba0[0x8c];
  rhs_01.Description[0x81] = in_stack_fffffffffffffba0[0x8d];
  rhs_01.Description[0x82] = in_stack_fffffffffffffba0[0x8e];
  rhs_01.Description[0x83] = in_stack_fffffffffffffba0[0x8f];
  rhs_01.Description[0x84] = in_stack_fffffffffffffba0[0x90];
  rhs_01.Description[0x85] = in_stack_fffffffffffffba0[0x91];
  rhs_01.Description[0x86] = in_stack_fffffffffffffba0[0x92];
  rhs_01.Description[0x87] = in_stack_fffffffffffffba0[0x93];
  rhs_01.Description[0x88] = in_stack_fffffffffffffba0[0x94];
  rhs_01.Description[0x89] = in_stack_fffffffffffffba0[0x95];
  rhs_01.Description[0x8a] = in_stack_fffffffffffffba0[0x96];
  rhs_01.Description[0x8b] = in_stack_fffffffffffffba0[0x97];
  rhs_01.Description[0x8c] = in_stack_fffffffffffffba0[0x98];
  rhs_01.Description[0x8d] = in_stack_fffffffffffffba0[0x99];
  rhs_01.Description[0x8e] = in_stack_fffffffffffffba0[0x9a];
  rhs_01.Description[0x8f] = in_stack_fffffffffffffba0[0x9b];
  rhs_01.Description[0x90] = in_stack_fffffffffffffba0[0x9c];
  rhs_01.Description[0x91] = in_stack_fffffffffffffba0[0x9d];
  rhs_01.Description[0x92] = in_stack_fffffffffffffba0[0x9e];
  rhs_01.Description[0x93] = in_stack_fffffffffffffba0[0x9f];
  rhs_01.Description[0x94] = in_stack_fffffffffffffba0[0xa0];
  rhs_01.Description[0x95] = in_stack_fffffffffffffba0[0xa1];
  rhs_01.Description[0x96] = in_stack_fffffffffffffba0[0xa2];
  rhs_01.Description[0x97] = in_stack_fffffffffffffba0[0xa3];
  rhs_01.Description[0x98] = in_stack_fffffffffffffba0[0xa4];
  rhs_01.Description[0x99] = in_stack_fffffffffffffba0[0xa5];
  rhs_01.Description[0x9a] = in_stack_fffffffffffffba0[0xa6];
  rhs_01.Description[0x9b] = in_stack_fffffffffffffba0[0xa7];
  rhs_01.Description[0x9c] = in_stack_fffffffffffffba0[0xa8];
  rhs_01.Description[0x9d] = in_stack_fffffffffffffba0[0xa9];
  rhs_01.Description[0x9e] = in_stack_fffffffffffffba0[0xaa];
  rhs_01.Description[0x9f] = in_stack_fffffffffffffba0[0xab];
  rhs_01.Description[0xa0] = in_stack_fffffffffffffba0[0xac];
  rhs_01.Description[0xa1] = in_stack_fffffffffffffba0[0xad];
  rhs_01.Description[0xa2] = in_stack_fffffffffffffba0[0xae];
  rhs_01.Description[0xa3] = in_stack_fffffffffffffba0[0xaf];
  rhs_01.Description[0xa4] = in_stack_fffffffffffffba0[0xb0];
  rhs_01.Description[0xa5] = in_stack_fffffffffffffba0[0xb1];
  rhs_01.Description[0xa6] = in_stack_fffffffffffffba0[0xb2];
  rhs_01.Description[0xa7] = in_stack_fffffffffffffba0[0xb3];
  rhs_01.Description[0xa8] = in_stack_fffffffffffffba0[0xb4];
  rhs_01.Description[0xa9] = in_stack_fffffffffffffba0[0xb5];
  rhs_01.Description[0xaa] = in_stack_fffffffffffffba0[0xb6];
  rhs_01.Description[0xab] = in_stack_fffffffffffffba0[0xb7];
  rhs_01.Description[0xac] = in_stack_fffffffffffffba0[0xb8];
  rhs_01.Description[0xad] = in_stack_fffffffffffffba0[0xb9];
  rhs_01.Description[0xae] = in_stack_fffffffffffffba0[0xba];
  rhs_01.Description[0xaf] = in_stack_fffffffffffffba0[0xbb];
  rhs_01.Description[0xb0] = in_stack_fffffffffffffba0[0xbc];
  rhs_01.Description[0xb1] = in_stack_fffffffffffffba0[0xbd];
  rhs_01.Description[0xb2] = in_stack_fffffffffffffba0[0xbe];
  rhs_01.Description[0xb3] = in_stack_fffffffffffffba0[0xbf];
  rhs_01.Description[0xb4] = in_stack_fffffffffffffba0[0xc0];
  rhs_01.Description[0xb5] = in_stack_fffffffffffffba0[0xc1];
  rhs_01.Description[0xb6] = in_stack_fffffffffffffba0[0xc2];
  rhs_01.Description[0xb7] = in_stack_fffffffffffffba0[0xc3];
  rhs_01.Description[0xb8] = in_stack_fffffffffffffba0[0xc4];
  rhs_01.Description[0xb9] = in_stack_fffffffffffffba0[0xc5];
  rhs_01.Description[0xba] = in_stack_fffffffffffffba0[0xc6];
  rhs_01.Description[0xbb] = in_stack_fffffffffffffba0[199];
  rhs_01.Description[0xbc] = in_stack_fffffffffffffba0[200];
  rhs_01.Description[0xbd] = in_stack_fffffffffffffba0[0xc9];
  rhs_01.Description[0xbe] = in_stack_fffffffffffffba0[0xca];
  rhs_01.Description[0xbf] = in_stack_fffffffffffffba0[0xcb];
  rhs_01.Description[0xc0] = in_stack_fffffffffffffba0[0xcc];
  rhs_01.Description[0xc1] = in_stack_fffffffffffffba0[0xcd];
  rhs_01.Description[0xc2] = in_stack_fffffffffffffba0[0xce];
  rhs_01.Description[0xc3] = in_stack_fffffffffffffba0[0xcf];
  rhs_01.Description[0xc4] = in_stack_fffffffffffffba0[0xd0];
  rhs_01.Description[0xc5] = in_stack_fffffffffffffba0[0xd1];
  rhs_01.Description[0xc6] = in_stack_fffffffffffffba0[0xd2];
  rhs_01.Description[199] = in_stack_fffffffffffffba0[0xd3];
  rhs_01.Description[200] = in_stack_fffffffffffffba0[0xd4];
  rhs_01.Description[0xc9] = in_stack_fffffffffffffba0[0xd5];
  rhs_01.Description[0xca] = in_stack_fffffffffffffba0[0xd6];
  rhs_01.Description[0xcb] = in_stack_fffffffffffffba0[0xd7];
  rhs_01.Description[0xcc] = in_stack_fffffffffffffba0[0xd8];
  rhs_01.Description[0xcd] = in_stack_fffffffffffffba0[0xd9];
  rhs_01.Description[0xce] = in_stack_fffffffffffffba0[0xda];
  rhs_01.Description[0xcf] = in_stack_fffffffffffffba0[0xdb];
  rhs_01.Description[0xd0] = in_stack_fffffffffffffba0[0xdc];
  rhs_01.Description[0xd1] = in_stack_fffffffffffffba0[0xdd];
  rhs_01.Description[0xd2] = in_stack_fffffffffffffba0[0xde];
  rhs_01.Description[0xd3] = in_stack_fffffffffffffba0[0xdf];
  rhs_01.Description[0xd4] = in_stack_fffffffffffffba0[0xe0];
  rhs_01.Description[0xd5] = in_stack_fffffffffffffba0[0xe1];
  rhs_01.Description[0xd6] = in_stack_fffffffffffffba0[0xe2];
  rhs_01.Description[0xd7] = in_stack_fffffffffffffba0[0xe3];
  rhs_01.Description[0xd8] = in_stack_fffffffffffffba0[0xe4];
  rhs_01.Description[0xd9] = in_stack_fffffffffffffba0[0xe5];
  rhs_01.Description[0xda] = in_stack_fffffffffffffba0[0xe6];
  rhs_01.Description[0xdb] = in_stack_fffffffffffffba0[0xe7];
  rhs_01.Description[0xdc] = in_stack_fffffffffffffba0[0xe8];
  rhs_01.Description[0xdd] = in_stack_fffffffffffffba0[0xe9];
  rhs_01.Description[0xde] = in_stack_fffffffffffffba0[0xea];
  rhs_01.Description[0xdf] = in_stack_fffffffffffffba0[0xeb];
  rhs_01.Description[0xe0] = in_stack_fffffffffffffba0[0xec];
  rhs_01.Description[0xe1] = in_stack_fffffffffffffba0[0xed];
  rhs_01.Description[0xe2] = in_stack_fffffffffffffba0[0xee];
  rhs_01.Description[0xe3] = in_stack_fffffffffffffba0[0xef];
  rhs_01.Description[0xe4] = in_stack_fffffffffffffba0[0xf0];
  rhs_01.Description[0xe5] = in_stack_fffffffffffffba0[0xf1];
  rhs_01.Description[0xe6] = in_stack_fffffffffffffba0[0xf2];
  rhs_01.Description[0xe7] = in_stack_fffffffffffffba0[0xf3];
  rhs_01.Description[0xe8] = in_stack_fffffffffffffba0[0xf4];
  rhs_01.Description[0xe9] = in_stack_fffffffffffffba0[0xf5];
  rhs_01.Description[0xea] = in_stack_fffffffffffffba0[0xf6];
  rhs_01.Description[0xeb] = in_stack_fffffffffffffba0[0xf7];
  rhs_01.Description[0xec] = in_stack_fffffffffffffba0[0xf8];
  rhs_01.Description[0xed] = in_stack_fffffffffffffba0[0xf9];
  rhs_01.Description[0xee] = in_stack_fffffffffffffba0[0xfa];
  rhs_01.Description[0xef] = in_stack_fffffffffffffba0[0xfb];
  rhs_01.Description[0xf0] = in_stack_fffffffffffffba0[0xfc];
  rhs_01.Description[0xf1] = in_stack_fffffffffffffba0[0xfd];
  rhs_01.Description[0xf2] = in_stack_fffffffffffffba0[0xfe];
  rhs_01.Description[0xf3] = in_stack_fffffffffffffba0[0xff];
  rhs_01.Description[0xf4] = in_stack_fffffffffffffba0[0x100];
  rhs_01.Description[0xf5] = in_stack_fffffffffffffba0[0x101];
  rhs_01.Description[0xf6] = in_stack_fffffffffffffba0[0x102];
  rhs_01.Description[0xf7] = in_stack_fffffffffffffba0[0x103];
  rhs_01.Description[0xf8] = in_stack_fffffffffffffba0[0x104];
  rhs_01.Description[0xf9] = in_stack_fffffffffffffba0[0x105];
  rhs_01.Description[0xfa] = in_stack_fffffffffffffba0[0x106];
  rhs_01.Description[0xfb] = in_stack_fffffffffffffba0[0x107];
  rhs_01.Description[0xfc] = in_stack_fffffffffffffba0[0x108];
  rhs_01.Description[0xfd] = in_stack_fffffffffffffba0[0x109];
  rhs_01.Description[0xfe] = in_stack_fffffffffffffba0[0x10a];
  rhs_01.Description[0xff] = in_stack_fffffffffffffba0[0x10b];
  rhs_01.Originator[0] = in_stack_fffffffffffffba0[0x10c];
  rhs_01.Originator[1] = in_stack_fffffffffffffba0[0x10d];
  rhs_01.Originator[2] = in_stack_fffffffffffffba0[0x10e];
  rhs_01.Originator[3] = in_stack_fffffffffffffba0[0x10f];
  rhs_01.Originator[4] = in_stack_fffffffffffffba0[0x110];
  rhs_01.Originator[5] = in_stack_fffffffffffffba0[0x111];
  rhs_01.Originator[6] = in_stack_fffffffffffffba0[0x112];
  rhs_01.Originator[7] = in_stack_fffffffffffffba0[0x113];
  rhs_01.Originator[8] = in_stack_fffffffffffffba0[0x114];
  rhs_01.Originator[9] = in_stack_fffffffffffffba0[0x115];
  rhs_01.Originator[10] = in_stack_fffffffffffffba0[0x116];
  rhs_01.Originator[0xb] = in_stack_fffffffffffffba0[0x117];
  rhs_01.Originator[0xc] = in_stack_fffffffffffffba0[0x118];
  rhs_01.Originator[0xd] = in_stack_fffffffffffffba0[0x119];
  rhs_01.Originator[0xe] = in_stack_fffffffffffffba0[0x11a];
  rhs_01.Originator[0xf] = in_stack_fffffffffffffba0[0x11b];
  rhs_01.Originator[0x10] = in_stack_fffffffffffffba0[0x11c];
  rhs_01.Originator[0x11] = in_stack_fffffffffffffba0[0x11d];
  rhs_01.Originator[0x12] = in_stack_fffffffffffffba0[0x11e];
  rhs_01.Originator[0x13] = in_stack_fffffffffffffba0[0x11f];
  rhs_01.Originator[0x14] = in_stack_fffffffffffffba0[0x120];
  rhs_01.Originator[0x15] = in_stack_fffffffffffffba0[0x121];
  rhs_01.Originator[0x16] = in_stack_fffffffffffffba0[0x122];
  rhs_01.Originator[0x17] = in_stack_fffffffffffffba0[0x123];
  rhs_01.Originator[0x18] = in_stack_fffffffffffffba0[0x124];
  rhs_01.Originator[0x19] = in_stack_fffffffffffffba0[0x125];
  rhs_01.Originator[0x1a] = in_stack_fffffffffffffba0[0x126];
  rhs_01.Originator[0x1b] = in_stack_fffffffffffffba0[0x127];
  rhs_01.Originator[0x1c] = in_stack_fffffffffffffba0[0x128];
  rhs_01.Originator[0x1d] = in_stack_fffffffffffffba0[0x129];
  rhs_01.Originator[0x1e] = in_stack_fffffffffffffba0[0x12a];
  rhs_01.Originator[0x1f] = in_stack_fffffffffffffba0[299];
  rhs_01.OriginatorReference[0] = in_stack_fffffffffffffba0[300];
  rhs_01.OriginatorReference[1] = in_stack_fffffffffffffba0[0x12d];
  rhs_01.OriginatorReference[2] = in_stack_fffffffffffffba0[0x12e];
  rhs_01.OriginatorReference[3] = in_stack_fffffffffffffba0[0x12f];
  rhs_01.OriginatorReference[4] = in_stack_fffffffffffffba0[0x130];
  rhs_01.OriginatorReference[5] = in_stack_fffffffffffffba0[0x131];
  rhs_01.OriginatorReference[6] = in_stack_fffffffffffffba0[0x132];
  rhs_01.OriginatorReference[7] = in_stack_fffffffffffffba0[0x133];
  rhs_01.OriginatorReference[8] = in_stack_fffffffffffffba0[0x134];
  rhs_01.OriginatorReference[9] = in_stack_fffffffffffffba0[0x135];
  rhs_01.OriginatorReference[10] = in_stack_fffffffffffffba0[0x136];
  rhs_01.OriginatorReference[0xb] = in_stack_fffffffffffffba0[0x137];
  rhs_01.OriginatorReference[0x14] = (char)in_stack_fffffffffffffce0;
  rhs_01.OriginatorReference[0x15] = (char)((uint)in_stack_fffffffffffffce0 >> 8);
  rhs_01.OriginatorReference[0x16] = (char)((uint)in_stack_fffffffffffffce0 >> 0x10);
  rhs_01.OriginatorReference[0x17] = (char)((uint)in_stack_fffffffffffffce0 >> 0x18);
  rhs_01.OriginatorReference[0x18] = (char)in_stack_fffffffffffffce4;
  rhs_01.OriginatorReference[0x19] = (char)((uint)in_stack_fffffffffffffce4 >> 8);
  rhs_01.OriginatorReference[0x1a] = (char)((uint)in_stack_fffffffffffffce4 >> 0x10);
  rhs_01.OriginatorReference[0x1b] = (char)((uint)in_stack_fffffffffffffce4 >> 0x18);
  rhs_01.OriginatorReference[0x1c] = (char)uVar5;
  rhs_01.OriginatorReference[0x1d] = (char)((ulong)uVar5 >> 8);
  rhs_01.OriginatorReference[0x1e] = (char)((ulong)uVar5 >> 0x10);
  rhs_01.OriginatorReference[0x1f] = (char)((ulong)uVar5 >> 0x18);
  rhs_01.OriginationDate[0] = (char)((ulong)uVar5 >> 0x20);
  rhs_01.OriginationDate[1] = (char)((ulong)uVar5 >> 0x28);
  rhs_01.OriginationDate[2] = (char)((ulong)uVar5 >> 0x30);
  rhs_01.OriginationDate[3] = (char)((ulong)uVar5 >> 0x38);
  rhs_01.OriginationDate[4] = (char)uVar6;
  rhs_01.OriginationDate[5] = (char)((ulong)uVar6 >> 8);
  rhs_01.OriginationDate[6] = (char)((ulong)uVar6 >> 0x10);
  rhs_01.OriginationDate[7] = (char)((ulong)uVar6 >> 0x18);
  rhs_01.OriginationDate[8] = (char)((ulong)uVar6 >> 0x20);
  rhs_01.OriginationDate[9] = (char)((ulong)uVar6 >> 0x28);
  rhs_01.OriginationTime[0] = (char)((ulong)uVar6 >> 0x30);
  rhs_01.OriginationTime[1] = (char)((ulong)uVar6 >> 0x38);
  rhs_01.OriginationTime[2] = (char)uVar7;
  rhs_01.OriginationTime[3] = (char)(uVar7 >> 8);
  rhs_01.OriginationTime[4] = (char)(uVar7 >> 0x10);
  rhs_01.OriginationTime[5] = (char)(uVar7 >> 0x18);
  rhs_01.OriginationTime[6] = (char)(uVar7 >> 0x20);
  rhs_01.OriginationTime[7] = (char)(uVar7 >> 0x28);
  rhs_01.Align = (short)(uVar7 >> 0x30);
  rhs_01.TimeReferenceLow = uVar8;
  rhs_01.TimeReferenceHigh = uVar9;
  rhs_01.Version = (short)uVar10;
  rhs_01.UMID[0] = (char)(uVar10 >> 0x10);
  rhs_01.UMID[1] = (char)(uVar10 >> 0x18);
  rhs_01.UMID[2] = (char)(uVar10 >> 0x20);
  rhs_01.UMID[3] = (char)(uVar10 >> 0x28);
  rhs_01.UMID[4] = (char)(uVar10 >> 0x30);
  rhs_01.UMID[5] = (char)(uVar10 >> 0x38);
  rhs_01.UMID[6] = (char)uVar11;
  rhs_01.UMID[7] = (char)((ulong)uVar11 >> 8);
  rhs_01.UMID[8] = (char)((ulong)uVar11 >> 0x10);
  rhs_01.UMID[9] = (char)((ulong)uVar11 >> 0x18);
  rhs_01.UMID[10] = (char)((ulong)uVar11 >> 0x20);
  rhs_01.UMID[0xb] = (char)((ulong)uVar11 >> 0x28);
  rhs_01.UMID[0xc] = (char)((ulong)uVar11 >> 0x30);
  rhs_01.UMID[0xd] = (char)((ulong)uVar11 >> 0x38);
  rhs_01.UMID[0xe] = (char)uVar12;
  rhs_01.UMID[0xf] = (char)((ulong)uVar12 >> 8);
  rhs_01.UMID[0x10] = (char)((ulong)uVar12 >> 0x10);
  rhs_01.UMID[0x11] = (char)((ulong)uVar12 >> 0x18);
  rhs_01.UMID[0x12] = (char)((ulong)uVar12 >> 0x20);
  rhs_01.UMID[0x13] = (char)((ulong)uVar12 >> 0x28);
  rhs_01.UMID[0x14] = (char)((ulong)uVar12 >> 0x30);
  rhs_01.UMID[0x15] = (char)((ulong)uVar12 >> 0x38);
  rhs_01.UMID[0x16] = (char)uVar13;
  rhs_01.UMID[0x17] = (char)((ulong)uVar13 >> 8);
  rhs_01.UMID[0x18] = (char)((ulong)uVar13 >> 0x10);
  rhs_01.UMID[0x19] = (char)((ulong)uVar13 >> 0x18);
  rhs_01.UMID[0x1a] = (char)((ulong)uVar13 >> 0x20);
  rhs_01.UMID[0x1b] = (char)((ulong)uVar13 >> 0x28);
  rhs_01.UMID[0x1c] = (char)((ulong)uVar13 >> 0x30);
  rhs_01.UMID[0x1d] = (char)((ulong)uVar13 >> 0x38);
  rhs_01.UMID[0x1e] = (char)uVar14;
  rhs_01.UMID[0x1f] = (char)((ulong)uVar14 >> 8);
  rhs_01.UMID[0x20] = (char)((ulong)uVar14 >> 0x10);
  rhs_01.UMID[0x21] = (char)((ulong)uVar14 >> 0x18);
  rhs_01.UMID[0x22] = (char)((ulong)uVar14 >> 0x20);
  rhs_01.UMID[0x23] = (char)((ulong)uVar14 >> 0x28);
  rhs_01.UMID[0x24] = (char)((ulong)uVar14 >> 0x30);
  rhs_01.UMID[0x25] = (char)((ulong)uVar14 >> 0x38);
  rhs_01.UMID[0x26] = in_stack_fffffffffffffd38[0];
  rhs_01.UMID[0x27] = in_stack_fffffffffffffd38[1];
  rhs_01.UMID[0x28] = in_stack_fffffffffffffd38[2];
  rhs_01.UMID[0x29] = in_stack_fffffffffffffd38[3];
  rhs_01.UMID[0x2a] = in_stack_fffffffffffffd38[4];
  rhs_01.UMID[0x2b] = in_stack_fffffffffffffd38[5];
  rhs_01.UMID[0x2c] = in_stack_fffffffffffffd38[6];
  rhs_01.UMID[0x2d] = in_stack_fffffffffffffd38[7];
  rhs_01.UMID[0x2e] = in_stack_fffffffffffffd38[8];
  rhs_01.UMID[0x2f] = in_stack_fffffffffffffd38[9];
  rhs_01.UMID[0x30] = in_stack_fffffffffffffd38[10];
  rhs_01.UMID[0x31] = in_stack_fffffffffffffd38[0xb];
  rhs_01.UMID[0x32] = in_stack_fffffffffffffd38[0xc];
  rhs_01.UMID[0x33] = in_stack_fffffffffffffd38[0xd];
  rhs_01.UMID[0x34] = in_stack_fffffffffffffd38[0xe];
  rhs_01.UMID[0x35] = in_stack_fffffffffffffd38[0xf];
  rhs_01.UMID[0x36] = in_stack_fffffffffffffd38[0x10];
  rhs_01.UMID[0x37] = in_stack_fffffffffffffd38[0x11];
  rhs_01.UMID[0x38] = in_stack_fffffffffffffd38[0x12];
  rhs_01.UMID[0x39] = in_stack_fffffffffffffd38[0x13];
  rhs_01.UMID[0x3a] = in_stack_fffffffffffffd38[0x14];
  rhs_01.UMID[0x3b] = in_stack_fffffffffffffd38[0x15];
  rhs_01.UMID[0x3c] = in_stack_fffffffffffffd38[0x16];
  rhs_01.UMID[0x3d] = in_stack_fffffffffffffd38[0x17];
  rhs_01.UMID[0x3e] = in_stack_fffffffffffffd38[0x18];
  rhs_01.UMID[0x3f] = in_stack_fffffffffffffd38[0x19];
  rhs_01.LoudnessValue = in_stack_fffffffffffffd38._26_2_;
  rhs_01.LoudnessRange = in_stack_fffffffffffffd38._28_2_;
  rhs_01.MaxTruePeakLevel = in_stack_fffffffffffffd38._30_2_;
  rhs_01.MaxMomentaryLoudness = in_stack_fffffffffffffd38._32_2_;
  rhs_01.MaxShortTermLoudness = in_stack_fffffffffffffd38._34_2_;
  rhs_01.Reserved[0] = in_stack_fffffffffffffd38[0x24];
  rhs_01.Reserved[1] = in_stack_fffffffffffffd38[0x25];
  rhs_01.Reserved[2] = in_stack_fffffffffffffd38[0x26];
  rhs_01.Reserved[3] = in_stack_fffffffffffffd38[0x27];
  rhs_01.Reserved[4] = in_stack_fffffffffffffd38[0x28];
  rhs_01.Reserved[5] = in_stack_fffffffffffffd38[0x29];
  rhs_01.Reserved[6] = in_stack_fffffffffffffd38[0x2a];
  rhs_01.Reserved[7] = in_stack_fffffffffffffd38[0x2b];
  rhs_01.Reserved[8] = in_stack_fffffffffffffd38[0x2c];
  rhs_01.Reserved[9] = in_stack_fffffffffffffd38[0x2d];
  rhs_01.Reserved[10] = in_stack_fffffffffffffd38[0x2e];
  rhs_01.Reserved[0xb] = in_stack_fffffffffffffd38[0x2f];
  rhs_01.Reserved[0xc] = in_stack_fffffffffffffd38[0x30];
  rhs_01.Reserved[0xd] = in_stack_fffffffffffffd38[0x31];
  rhs_01.Reserved[0xe] = in_stack_fffffffffffffd38[0x32];
  rhs_01.Reserved[0xf] = in_stack_fffffffffffffd38[0x33];
  rhs_01.Reserved[0x10] = in_stack_fffffffffffffd38[0x34];
  rhs_01.Reserved[0x11] = in_stack_fffffffffffffd38[0x35];
  rhs_01.Reserved[0x12] = in_stack_fffffffffffffd38[0x36];
  rhs_01.Reserved[0x13] = in_stack_fffffffffffffd38[0x37];
  rhs_01.Reserved[0x14] = in_stack_fffffffffffffd38[0x38];
  rhs_01.Reserved[0x15] = in_stack_fffffffffffffd38[0x39];
  rhs_01.Reserved[0x16] = in_stack_fffffffffffffd38[0x3a];
  rhs_01.Reserved[0x17] = in_stack_fffffffffffffd38[0x3b];
  rhs_01.Reserved[0x18] = in_stack_fffffffffffffd38[0x3c];
  rhs_01.Reserved[0x19] = in_stack_fffffffffffffd38[0x3d];
  rhs_01.Reserved[0x1a] = in_stack_fffffffffffffd38[0x3e];
  rhs_01.Reserved[0x1b] = in_stack_fffffffffffffd38[0x3f];
  rhs_01.Reserved[0x1c] = (char)in_stack_fffffffffffffd78;
  rhs_01.Reserved[0x1d] = (char)((uint)in_stack_fffffffffffffd78 >> 8);
  rhs_01.Reserved[0x1e] = (char)((uint)in_stack_fffffffffffffd78 >> 0x10);
  rhs_01.Reserved[0x1f] = (char)((uint)in_stack_fffffffffffffd78 >> 0x18);
  rhs_01.Reserved[0x20] = in_stack_fffffffffffffd7c[0];
  rhs_01.Reserved[0x21] = in_stack_fffffffffffffd7c[1];
  rhs_01.Reserved[0x22] = in_stack_fffffffffffffd7c[2];
  rhs_01.Reserved[0x23] = in_stack_fffffffffffffd7c[3];
  rhs_01.Reserved[0x24] = in_stack_fffffffffffffd7c[4];
  rhs_01.Reserved[0x25] = in_stack_fffffffffffffd7c[5];
  rhs_01.Reserved[0x26] = in_stack_fffffffffffffd7c[6];
  rhs_01.Reserved[0x27] = in_stack_fffffffffffffd7c[7];
  rhs_01.Reserved[0x28] = in_stack_fffffffffffffd7c[8];
  rhs_01.Reserved[0x29] = in_stack_fffffffffffffd7c[9];
  rhs_01.Reserved[0x2a] = in_stack_fffffffffffffd7c[10];
  rhs_01.Reserved[0x2b] = in_stack_fffffffffffffd7c[0xb];
  rhs_01.Reserved[0x2c] = in_stack_fffffffffffffd7c[0xc];
  rhs_01.Reserved[0x2d] = in_stack_fffffffffffffd7c[0xd];
  rhs_01.Reserved[0x2e] = in_stack_fffffffffffffd7c[0xe];
  rhs_01.Reserved[0x2f] = in_stack_fffffffffffffd7c[0xf];
  rhs_01.Reserved[0x30] = in_stack_fffffffffffffd7c[0x10];
  rhs_01.Reserved[0x31] = in_stack_fffffffffffffd7c[0x11];
  rhs_01.Reserved[0x32] = in_stack_fffffffffffffd7c[0x12];
  rhs_01.Reserved[0x33] = in_stack_fffffffffffffd7c[0x13];
  rhs_01.Reserved[0x34] = in_stack_fffffffffffffd7c[0x14];
  rhs_01.Reserved[0x35] = in_stack_fffffffffffffd7c[0x15];
  rhs_01.Reserved[0x36] = in_stack_fffffffffffffd7c[0x16];
  rhs_01.Reserved[0x37] = in_stack_fffffffffffffd7c[0x17];
  rhs_01.Reserved[0x38] = in_stack_fffffffffffffd7c[0x18];
  rhs_01.Reserved[0x39] = in_stack_fffffffffffffd7c[0x19];
  rhs_01.Reserved[0x3a] = in_stack_fffffffffffffd7c[0x1a];
  rhs_01.Reserved[0x3b] = in_stack_fffffffffffffd7c[0x1b];
  rhs_01.Reserved[0x3c] = in_stack_fffffffffffffd7c[0x1c];
  rhs_01.Reserved[0x3d] = in_stack_fffffffffffffd7c[0x1d];
  rhs_01.Reserved[0x3e] = in_stack_fffffffffffffd7c[0x1e];
  rhs_01.Reserved[0x3f] = in_stack_fffffffffffffd7c[0x1f];
  rhs_01.Reserved[0x40] = in_stack_fffffffffffffd7c[0x20];
  rhs_01.Reserved[0x41] = in_stack_fffffffffffffd7c[0x21];
  rhs_01.Reserved[0x42] = in_stack_fffffffffffffd7c[0x22];
  rhs_01.Reserved[0x43] = in_stack_fffffffffffffd7c[0x23];
  rhs_01.Reserved[0x44] = in_stack_fffffffffffffd7c[0x24];
  rhs_01.Reserved[0x45] = in_stack_fffffffffffffd7c[0x25];
  rhs_01.Reserved[0x46] = in_stack_fffffffffffffd7c[0x26];
  rhs_01.Reserved[0x47] = in_stack_fffffffffffffd7c[0x27];
  rhs_01.Reserved[0x48] = in_stack_fffffffffffffd7c[0x28];
  rhs_01.Reserved[0x49] = in_stack_fffffffffffffd7c[0x29];
  rhs_01.Reserved[0x4a] = in_stack_fffffffffffffd7c[0x2a];
  rhs_01.Reserved[0x4b] = in_stack_fffffffffffffd7c[0x2b];
  rhs_01.Reserved[0x4c] = in_stack_fffffffffffffd7c[0x2c];
  rhs_01.Reserved[0x4d] = in_stack_fffffffffffffd7c[0x2d];
  rhs_01.Reserved[0x4e] = in_stack_fffffffffffffd7c[0x2e];
  rhs_01.Reserved[0x4f] = in_stack_fffffffffffffd7c[0x2f];
  rhs_01.Reserved[0x50] = in_stack_fffffffffffffd7c[0x30];
  rhs_01.Reserved[0x51] = in_stack_fffffffffffffd7c[0x31];
  rhs_01.Reserved[0x52] = in_stack_fffffffffffffd7c[0x32];
  rhs_01.Reserved[0x53] = in_stack_fffffffffffffd7c[0x33];
  rhs_01.Reserved[0x54] = in_stack_fffffffffffffd7c[0x34];
  rhs_01.Reserved[0x55] = in_stack_fffffffffffffd7c[0x35];
  rhs_01.Reserved[0x56] = in_stack_fffffffffffffd7c[0x36];
  rhs_01.Reserved[0x57] = in_stack_fffffffffffffd7c[0x37];
  rhs_01.Reserved[0x58] = in_stack_fffffffffffffd7c[0x38];
  rhs_01.Reserved[0x59] = in_stack_fffffffffffffd7c[0x39];
  rhs_01.Reserved[0x5a] = in_stack_fffffffffffffd7c[0x3a];
  rhs_01.Reserved[0x5b] = in_stack_fffffffffffffd7c[0x3b];
  rhs_01.Reserved[0x5c] = in_stack_fffffffffffffd7c[0x3c];
  rhs_01.Reserved[0x5d] = in_stack_fffffffffffffd7c[0x3d];
  rhs_01.Reserved[0x5e] = in_stack_fffffffffffffd7c[0x3e];
  rhs_01.Reserved[0x5f] = in_stack_fffffffffffffd7c[0x3f];
  rhs_01.Reserved[0x60] = in_stack_fffffffffffffd7c[0x40];
  rhs_01.Reserved[0x61] = in_stack_fffffffffffffd7c[0x41];
  rhs_01.Reserved[0x62] = in_stack_fffffffffffffd7c[0x42];
  rhs_01.Reserved[99] = in_stack_fffffffffffffd7c[0x43];
  rhs_01.Reserved[100] = in_stack_fffffffffffffd7c[0x44];
  rhs_01.Reserved[0x65] = in_stack_fffffffffffffd7c[0x45];
  rhs_01.Reserved[0x66] = in_stack_fffffffffffffd7c[0x46];
  rhs_01.Reserved[0x67] = in_stack_fffffffffffffd7c[0x47];
  rhs_01.Reserved[0x68] = in_stack_fffffffffffffd7c[0x48];
  rhs_01.Reserved[0x69] = in_stack_fffffffffffffd7c[0x49];
  rhs_01.Reserved[0x6a] = in_stack_fffffffffffffd7c[0x4a];
  rhs_01.Reserved[0x6b] = in_stack_fffffffffffffd7c[0x4b];
  rhs_01.Reserved[0x6c] = in_stack_fffffffffffffd7c[0x4c];
  rhs_01.Reserved[0x6d] = in_stack_fffffffffffffd7c[0x4d];
  rhs_01.Reserved[0x6e] = in_stack_fffffffffffffd7c[0x4e];
  rhs_01.Reserved[0x6f] = in_stack_fffffffffffffd7c[0x4f];
  rhs_01.Reserved[0x70] = in_stack_fffffffffffffd7c[0x50];
  rhs_01.Reserved[0x71] = in_stack_fffffffffffffd7c[0x51];
  rhs_01.Reserved[0x72] = in_stack_fffffffffffffd7c[0x52];
  rhs_01.Reserved[0x73] = in_stack_fffffffffffffd7c[0x53];
  rhs_01.Reserved[0x74] = in_stack_fffffffffffffd7c[0x54];
  rhs_01.Reserved[0x75] = in_stack_fffffffffffffd7c[0x55];
  rhs_01.Reserved[0x76] = in_stack_fffffffffffffd7c[0x56];
  rhs_01.Reserved[0x77] = in_stack_fffffffffffffd7c[0x57];
  rhs_01.Reserved[0x78] = in_stack_fffffffffffffd7c[0x58];
  rhs_01.Reserved[0x79] = in_stack_fffffffffffffd7c[0x59];
  rhs_01.Reserved[0x7a] = in_stack_fffffffffffffd7c[0x5a];
  rhs_01.Reserved[0x7b] = in_stack_fffffffffffffd7c[0x5b];
  rhs_01.Reserved[0x7c] = in_stack_fffffffffffffd7c[0x5c];
  rhs_01.Reserved[0x7d] = in_stack_fffffffffffffd7c[0x5d];
  rhs_01.Reserved[0x7e] = in_stack_fffffffffffffd7c[0x5e];
  rhs_01.Reserved[0x7f] = in_stack_fffffffffffffd7c[0x5f];
  rhs_01.Reserved[0x80] = in_stack_fffffffffffffd7c[0x60];
  rhs_01.Reserved[0x81] = in_stack_fffffffffffffd7c[0x61];
  rhs_01.Reserved[0x82] = in_stack_fffffffffffffd7c[0x62];
  rhs_01.Reserved[0x83] = in_stack_fffffffffffffd7c[99];
  rhs_01.Reserved[0x84] = in_stack_fffffffffffffd7c[100];
  rhs_01.Reserved[0x85] = in_stack_fffffffffffffd7c[0x65];
  rhs_01.Reserved[0x86] = in_stack_fffffffffffffd7c[0x66];
  rhs_01.Reserved[0x87] = in_stack_fffffffffffffd7c[0x67];
  rhs_01.Reserved[0x88] = in_stack_fffffffffffffd7c[0x68];
  rhs_01.Reserved[0x89] = in_stack_fffffffffffffd7c[0x69];
  rhs_01.Reserved[0x8a] = in_stack_fffffffffffffd7c[0x6a];
  rhs_01.Reserved[0x8b] = in_stack_fffffffffffffd7c[0x6b];
  rhs_01.Reserved[0x8c] = in_stack_fffffffffffffd7c[0x6c];
  rhs_01.Reserved[0x8d] = in_stack_fffffffffffffd7c[0x6d];
  rhs_01.Reserved[0x8e] = in_stack_fffffffffffffd7c[0x6e];
  rhs_01.Reserved[0x8f] = in_stack_fffffffffffffd7c[0x6f];
  rhs_01.Reserved[0x90] = in_stack_fffffffffffffd7c[0x70];
  rhs_01.Reserved[0x91] = in_stack_fffffffffffffd7c[0x71];
  rhs_01.Reserved[0x92] = in_stack_fffffffffffffd7c[0x72];
  rhs_01.Reserved[0x93] = in_stack_fffffffffffffd7c[0x73];
  rhs_01.Reserved[0x94] = in_stack_fffffffffffffd7c[0x74];
  rhs_01.Reserved[0x95] = in_stack_fffffffffffffd7c[0x75];
  rhs_01.Reserved[0x96] = in_stack_fffffffffffffd7c[0x76];
  rhs_01.Reserved[0x97] = in_stack_fffffffffffffd7c[0x77];
  rhs_01.Reserved[0x98] = in_stack_fffffffffffffd7c[0x78];
  rhs_01.Reserved[0x99] = in_stack_fffffffffffffd7c[0x79];
  rhs_01.Reserved[0x9a] = in_stack_fffffffffffffd7c[0x7a];
  rhs_01.Reserved[0x9b] = in_stack_fffffffffffffd7c[0x7b];
  rhs_01.Reserved[0x9c] = in_stack_fffffffffffffd7c[0x7c];
  rhs_01.Reserved[0x9d] = in_stack_fffffffffffffd7c[0x7d];
  rhs_01.Reserved[0x9e] = in_stack_fffffffffffffd7c[0x7e];
  rhs_01.Reserved[0x9f] = in_stack_fffffffffffffd7c[0x7f];
  rhs_01.Reserved[0xa0] = in_stack_fffffffffffffd7c[0x80];
  rhs_01.Reserved[0xa1] = in_stack_fffffffffffffd7c[0x81];
  rhs_01.Reserved[0xa2] = in_stack_fffffffffffffd7c[0x82];
  rhs_01.Reserved[0xa3] = in_stack_fffffffffffffd7c[0x83];
  rhs_01.Reserved[0xa4] = in_stack_fffffffffffffd7c[0x84];
  rhs_01.Reserved[0xa5] = in_stack_fffffffffffffd7c[0x85];
  rhs_01.Reserved[0xa6] = in_stack_fffffffffffffd7c[0x86];
  rhs_01.Reserved[0xa7] = in_stack_fffffffffffffd7c[0x87];
  rhs_01.Reserved[0xa8] = in_stack_fffffffffffffd7c[0x88];
  rhs_01.Reserved[0xa9] = in_stack_fffffffffffffd7c[0x89];
  rhs_01.Reserved[0xaa] = in_stack_fffffffffffffd7c[0x8a];
  rhs_01.Reserved[0xab] = in_stack_fffffffffffffd7c[0x8b];
  rhs_01.Reserved[0xac] = in_stack_fffffffffffffd7c[0x8c];
  rhs_01.Reserved[0xad] = in_stack_fffffffffffffd7c[0x8d];
  rhs_01.Reserved[0xae] = in_stack_fffffffffffffd7c[0x8e];
  rhs_01.Reserved[0xaf] = in_stack_fffffffffffffd7c[0x8f];
  rhs_01.Reserved[0xb0] = in_stack_fffffffffffffd7c[0x90];
  rhs_01.Reserved[0xb1] = in_stack_fffffffffffffd7c[0x91];
  rhs_01.Reserved[0xb2] = in_stack_fffffffffffffd7c[0x92];
  rhs_01.Reserved[0xb3] = in_stack_fffffffffffffd7c[0x93];
  PrintBextChunk(rhs_01);
  local_598 = *(undefined8 *)&wavHeader->DataChunk;
  uStackY_590 = CONCAT44(uStackY_590._4_4_,*(undefined4 *)((long)&(wavHeader->DataChunk).ckSize + 4)
                        );
  PrintDataChunk(in_stack_fffffffffffffaf0);
  return;
}

Assistant:

void WavParserHelper::PrintRF64Header(RF64Header *wavHeader)
{
	PrintRF64Chunk(wavHeader->RF64Chunk);
	PrintDS64Chunk(wavHeader->DS64Chunk);
	PrintExtensibleFmtChunk(wavHeader->fmtChunk);
	PrintBextChunk(wavHeader->BextChunk);
	//PrintJunkChunk(wavHeader->JunkChunk);
	PrintDataChunk(wavHeader->DataChunk);
}